

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall bloom_tests::merkle_block_1::test_method(merkle_block_1 *this)

{
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  bool bVar1;
  reference __src;
  size_type sVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  uint i_1;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  CBloomFilter filter;
  pair<unsigned_int,_uint256> pair;
  CMerkleBlock merkleBlock;
  CBlock block;
  char *in_stack_fffffffffffff318;
  CMerkleBlock *in_stack_fffffffffffff320;
  char *in_stack_fffffffffffff328;
  base_blob<256U> *in_stack_fffffffffffff330;
  undefined7 in_stack_fffffffffffff338;
  undefined1 in_stack_fffffffffffff33f;
  lazy_ostream *in_stack_fffffffffffff340;
  reference in_stack_fffffffffffff348;
  undefined7 in_stack_fffffffffffff350;
  undefined1 in_stack_fffffffffffff357;
  unit_test_log_t *in_stack_fffffffffffff358;
  unit_test_log_t *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff360;
  undefined7 in_stack_fffffffffffff368;
  undefined1 in_stack_fffffffffffff36f;
  CPartialMerkleTree *in_stack_fffffffffffff370;
  CBloomFilter *in_stack_fffffffffffff378;
  uint local_af0;
  uint local_aec;
  const_string local_ad0 [2];
  lazy_ostream local_ab0 [2];
  assertion_result local_a90 [2];
  const_string local_a58 [2];
  lazy_ostream local_a38 [2];
  assertion_result local_a18 [2];
  const_string local_9e0 [2];
  lazy_ostream local_9c0 [2];
  assertion_result local_9a0 [2];
  const_string local_968 [2];
  lazy_ostream local_948 [2];
  assertion_result local_928 [2];
  const_string local_8f0 [2];
  lazy_ostream local_8d0 [2];
  assertion_result local_8b0 [2];
  const_string local_878 [2];
  lazy_ostream local_858 [2];
  assertion_result local_838 [2];
  const_string local_800 [2];
  lazy_ostream local_7e0 [2];
  assertion_result local_7c0 [2];
  const_string local_788 [2];
  lazy_ostream local_768 [2];
  assertion_result local_748 [3];
  const_string local_700 [2];
  lazy_ostream local_6e0 [2];
  assertion_result local_6c0 [2];
  const_string local_688 [2];
  lazy_ostream local_668 [2];
  assertion_result local_648 [2];
  const_string local_610 [2];
  lazy_ostream local_5f0 [2];
  assertion_result local_5d0 [4];
  const_string local_568 [2];
  lazy_ostream local_548 [2];
  assertion_result local_528 [2];
  const_string local_4f0 [2];
  lazy_ostream local_4d0 [2];
  assertion_result local_4b0 [2];
  CMerkleBlock local_474;
  undefined1 local_370;
  undefined1 local_36f;
  undefined1 local_36e;
  undefined1 local_36d;
  undefined1 local_36c;
  undefined1 local_36b;
  undefined1 local_36a;
  undefined1 local_369;
  undefined1 local_368;
  undefined1 local_367;
  undefined1 local_366;
  undefined1 local_365;
  undefined1 local_364;
  undefined1 local_363;
  undefined1 local_362;
  undefined1 local_361;
  undefined1 local_360;
  undefined1 local_35f;
  undefined1 local_35e;
  undefined1 local_35d;
  undefined1 local_35c;
  undefined1 local_35b;
  undefined1 local_35a;
  undefined1 local_359;
  undefined1 local_358;
  undefined1 local_357;
  undefined1 local_356;
  undefined1 local_355;
  undefined1 local_354;
  undefined1 local_353;
  undefined1 local_352;
  undefined1 local_351;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined1 local_24a;
  undefined1 local_249;
  undefined1 local_248;
  undefined1 local_247;
  undefined1 local_246;
  undefined1 local_245;
  undefined1 local_244;
  undefined1 local_243;
  undefined1 local_242;
  undefined1 local_241;
  undefined1 local_240;
  undefined1 local_23f;
  undefined1 local_23e;
  undefined1 local_23d;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  undefined1 local_239;
  undefined1 local_238;
  undefined1 local_237;
  undefined1 local_236;
  undefined1 local_235;
  undefined1 local_214;
  undefined1 local_213;
  undefined1 local_212;
  undefined1 local_211;
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4 [68];
  CMerkleBlock local_1b0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  getBlock13b8a();
  CBloomFilter::CBloomFilter
            (in_stack_fffffffffffff378,(uint)((ulong)in_stack_fffffffffffff370 >> 0x20),
             (double)CONCAT17(in_stack_fffffffffffff36f,in_stack_fffffffffffff368),
             (uint)((ulong)in_stack_fffffffffffff360 >> 0x20),
             (uchar)((ulong)in_stack_fffffffffffff360 >> 0x18));
  local_79 = 0x74;
  local_7a = 0xd6;
  local_7b = 0x81;
  local_7c = 0xe0;
  local_7d = 0xe0;
  local_7e = 0x3b;
  local_7f = 0xaf;
  local_80 = 0xa8;
  local_81 = 2;
  local_82 = 200;
  local_83 = 0xaa;
  local_84 = 8;
  local_85 = 0x43;
  local_86 = 0x79;
  local_87 = 0xaa;
  local_88 = 0x98;
  local_89 = 0xd9;
  local_8a = 0xfc;
  local_8b = 0xd6;
  local_8c = 0x32;
  local_8d = 0xdd;
  local_8e = 0xc2;
  local_8f = 0xed;
  local_90 = 0x97;
  local_91 = 0x82;
  local_92 = 0xb5;
  local_93 = 0x86;
  local_94 = 0xec;
  local_95 = 0x87;
  local_96 = 0x45;
  local_97 = 0x1f;
  local_98 = 0x20;
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff328,
             (uint256 *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  vKey.m_size = (size_t)in_stack_fffffffffffff348;
  vKey.m_data = (uchar *)in_stack_fffffffffffff340;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffff328,vKey);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)in_stack_fffffffffffff328,(CBlock *)in_stack_fffffffffffff320,
             (CBloomFilter *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,(char (*) [1])in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338));
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_fffffffffffff330);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338));
    base_blob<256u>::GetHex_abi_cxx11_(in_stack_fffffffffffff330);
    in_stack_fffffffffffff328 = "block.GetHash().GetHex()";
    in_stack_fffffffffffff320 = &local_1b0;
    in_stack_fffffffffffff318 = "merkleBlock.header.GetHash().GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              ((undefined1 *)
               ((long)&local_474.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data + 0x14),
               (undefined1 *)
               ((long)&local_474.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data + 4),0xb5,1,2,
               (uchar *)((long)local_1b0.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                        + 0x1c));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff318);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff318);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,(char (*) [1])in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    local_474.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_8_ =
         std::
         vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ::size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                 *)in_stack_fffffffffffff318);
    local_474.header.nVersion = 1;
    in_stack_fffffffffffff328 = "1U";
    in_stack_fffffffffffff320 = &local_474;
    in_stack_fffffffffffff318 = "merkleBlock.vMatchedTxn.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((uchar *)((long)local_474.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                        + 0x18),
               (uchar *)((long)local_474.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                        + 8),0xb7,1,2,&local_474.header.hashPrevBlock);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  __src = std::
          vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          ::operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
  memcpy(local_1f4,__src,0x24);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
    local_1f5 = 0x74;
    local_1f6 = 0xd6;
    local_1f7 = 0x81;
    local_1f8 = 0xe0;
    local_1f9 = 0xe0;
    local_1fa = 0x3b;
    local_1fb = 0xaf;
    local_1fc = 0xa8;
    local_1fd = 2;
    local_1fe = 200;
    local_1ff = 0xaa;
    local_200 = 8;
    local_201 = 0x43;
    local_202 = 0x79;
    local_203 = 0xaa;
    local_204 = 0x98;
    local_205 = 0xd9;
    local_206 = 0xfc;
    local_207 = 0xd6;
    local_208 = 0x32;
    local_209 = 0xdd;
    local_20a = 0xc2;
    local_20b = 0xed;
    local_20c = 0x97;
    local_20d = 0x82;
    local_20e = 0xb5;
    local_20f = 0x86;
    local_210 = 0xec;
    local_211 = 0x87;
    local_212 = 0x45;
    local_213 = 0x1f;
    local_214 = 0x20;
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                 (base_blob<256U> *)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b0,local_4d0,local_4f0,0xba,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_528,local_548,local_568,0xbb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff318);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    CPartialMerkleTree::ExtractMatches
              (in_stack_fffffffffffff370,
               (vector<uint256,_std::allocator<uint256>_> *)
               CONCAT17(in_stack_fffffffffffff36f,in_stack_fffffffffffff368),
               in_stack_fffffffffffff360);
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                 (base_blob<256U> *)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5d0,local_5f0,local_610,0xbf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff318);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_648,local_668,local_688,0xc0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_aec = 0;
      sVar2 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff318),
      local_aec < sVar2; local_aec = local_aec + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
                 (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff358,
                 (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
                 (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff328,
                 (size_type)in_stack_fffffffffffff320);
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
      ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                   (base_blob<256U> *)in_stack_fffffffffffff320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff328,
                 SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
                 (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff320,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff318);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
                 (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
      in_stack_fffffffffffff318 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_6c0,local_6e0,local_700,0xc2,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff318);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff318);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  local_235 = 0xdd;
  local_236 = 0x1f;
  local_237 = 0xd2;
  local_238 = 0xa6;
  local_239 = 0xfc;
  local_23a = 0x16;
  local_23b = 0x40;
  local_23c = 0x4f;
  local_23d = 0xaf;
  local_23e = 0x33;
  local_23f = 0x98;
  local_240 = 0x81;
  local_241 = 0xa9;
  local_242 = 10;
  local_243 = 0xdb;
  local_244 = 0xde;
  local_245 = 0x7f;
  local_246 = 0x4f;
  local_247 = 0x72;
  local_248 = 0x86;
  local_249 = 0x91;
  local_24a = 0xac;
  local_24b = 0x62;
  local_24c = 0xe8;
  local_24d = 0xf1;
  local_24e = 0x68;
  local_24f = 0x80;
  local_250 = 0x9c;
  local_251 = 0xdf;
  local_252 = 0xae;
  local_253 = 0x10;
  local_254 = 0x53;
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff328,
             (uint256 *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  vKey_00.m_size = (size_t)in_stack_fffffffffffff348;
  vKey_00.m_data = (uchar *)in_stack_fffffffffffff340;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffff328,vKey_00);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)in_stack_fffffffffffff328,(CBlock *)in_stack_fffffffffffff320,
             (CBloomFilter *)in_stack_fffffffffffff318);
  CMerkleBlock::operator=((CMerkleBlock *)in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  CMerkleBlock::~CMerkleBlock((CMerkleBlock *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338));
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338));
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                 (base_blob<256U> *)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_748,local_768,local_788,199,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7c0,local_7e0,local_800,0xc9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
    std::operator==((pair<unsigned_int,_uint256> *)in_stack_fffffffffffff328,
                    (pair<unsigned_int,_uint256> *)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_838,local_858,local_878,0xcb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
    local_351 = 0xdd;
    local_352 = 0x1f;
    local_353 = 0xd2;
    local_354 = 0xa6;
    local_355 = 0xfc;
    local_356 = 0x16;
    local_357 = 0x40;
    local_358 = 0x4f;
    local_359 = 0xaf;
    local_35a = 0x33;
    local_35b = 0x98;
    local_35c = 0x81;
    local_35d = 0xa9;
    local_35e = 10;
    local_35f = 0xdb;
    local_360 = 0xde;
    local_361 = 0x7f;
    local_362 = 0x4f;
    local_363 = 0x72;
    local_364 = 0x86;
    local_365 = 0x91;
    local_366 = 0xac;
    local_367 = 0x62;
    local_368 = 0xe8;
    local_369 = 0xf1;
    local_36a = 0x68;
    local_36b = 0x80;
    local_36c = 0x9c;
    local_36d = 0xdf;
    local_36e = 0xae;
    local_36f = 0x10;
    local_370 = 0x53;
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                 (base_blob<256U> *)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b0,local_8d0,local_8f0,0xcd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_928,local_948,local_968,0xce,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    CPartialMerkleTree::ExtractMatches
              (in_stack_fffffffffffff370,
               (vector<uint256,_std::allocator<uint256>_> *)
               CONCAT17(in_stack_fffffffffffff36f,in_stack_fffffffffffff368),
               in_stack_fffffffffffff360);
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                 (base_blob<256U> *)in_stack_fffffffffffff320);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9a0,local_9c0,local_9e0,0xd0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff358,
               (const_string *)CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
               (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff318);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff320,
               (basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a18,local_a38,local_a58,0xd1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_af0 = 0;
  while( true ) {
    uVar3 = (ulong)local_af0;
    sVar2 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff318);
    if (sVar2 <= uVar3) break;
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
                 (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this_00,(const_string *)
                         CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
                 (size_t)in_stack_fffffffffffff348,(const_string *)in_stack_fffffffffffff340);
      in_stack_fffffffffffff348 =
           std::vector<uint256,_std::allocator<uint256>_>::operator[]
                     ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff328,
                      (size_type)in_stack_fffffffffffff320);
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)in_stack_fffffffffffff328,(size_type)in_stack_fffffffffffff320);
      in_stack_fffffffffffff357 =
           ::operator==((base_blob<256U> *)in_stack_fffffffffffff328,
                        (base_blob<256U> *)in_stack_fffffffffffff320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff328,
                 SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
      in_stack_fffffffffffff340 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
                 (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff320,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff318);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
                 (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
      in_stack_fffffffffffff318 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_a90,local_ab0,local_ad0,0xd3,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff318);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff318);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_af0 = local_af0 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff328);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff328);
  CMerkleBlock::~CMerkleBlock((CMerkleBlock *)in_stack_fffffffffffff318);
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_fffffffffffff318);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff318);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_1)
{
    CBlock block = getBlock13b8a();
    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the last transaction
    filter.insert(uint256{"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK_EQUAL(merkleBlock.header.GetHash().GetHex(), block.GetHash().GetHex());

    BOOST_CHECK_EQUAL(merkleBlock.vMatchedTxn.size(), 1U);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 8);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Also match the 8th transaction
    filter.insert(uint256{"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053"});
    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 2);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1] == pair);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 7);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}